

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_3.c
# Opt level: O0

void write_packet(rfc5444_writer *w,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  char *pcVar1;
  undefined1 local_68 [8];
  autobuf out;
  uint8_t *buf;
  size_t j;
  size_t i;
  size_t length_local;
  void *buffer_local;
  rfc5444_writer_target *iface_local;
  rfc5444_writer *w_local;
  
  out._24_8_ = buffer;
  for (buf = (uint8_t *)0x0; buf < length; buf = buf + 0x20) {
    printf("%04zx:",buf);
    for (j = (size_t)buf; j < length && j < buf + 0x20; j = j + 1) {
      pcVar1 = "";
      if ((j & 3) == 0) {
        pcVar1 = " ";
      }
      printf("%s%02x",pcVar1,(ulong)*(byte *)(out._24_8_ + j));
    }
    printf("\n");
  }
  printf("\n");
  abuf_init(local_68);
  rfc5444_print_raw(local_68,out._24_8_,length);
  printf("%s\n",out._len);
  abuf_free(local_68);
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *w __attribute__ ((unused)),
    struct rfc5444_writer_target *iface __attribute__((unused)),
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;
  struct autobuf out;

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+32; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");

  abuf_init(&out);
  rfc5444_print_raw(&out, buf, length);
#if 0
  abuf_puts(&out, "\n\n\n");
  rfc5444_print_direct(&out, buf, length);
#endif

  printf("%s\n", abuf_getptr(&out));
  abuf_free(&out);
#if 0
  CHECK_TRUE(length == sizeof(result), "Result has wrong length: %zu != %zu", length, sizeof(result));
  if (length == sizeof(result)) {
    CHECK_TRUE(memcmp(result, buffer, sizeof(result)) == 0, "Result differs from pattern");
  }
#endif
}